

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> __thiscall
fmt::v8::detail::digit_grouping<char8_t>::
apply<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char>
          (digit_grouping<char8_t> *this,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out
          ,basic_string_view<char> digits)

{
  ulong uVar1;
  char8_t cVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  char *pcVar9;
  int iVar10;
  undefined4 *puVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  undefined **local_828;
  undefined4 *local_820;
  ulong local_818;
  ulong local_810;
  undefined4 local_808 [502];
  
  uVar6 = digits.size_;
  puVar11 = local_808;
  local_828 = &PTR_grow_00126b88;
  local_810 = 500;
  local_818 = 1;
  local_808[0] = 0;
  cVar3 = (this->sep_).thousands_sep;
  uVar12 = (uint)digits.size_;
  local_820 = puVar11;
  if (cVar3 != '\0') {
    pcVar13 = (this->sep_).grouping._M_dataplus._M_p;
    iVar10 = 0;
    do {
      pcVar9 = (this->sep_).grouping._M_dataplus._M_p + (this->sep_).grouping._M_string_length;
      if (pcVar13 == pcVar9) {
        cVar8 = pcVar9[-1];
      }
      else {
        cVar8 = *pcVar13;
        if ((byte)(cVar8 + 0x81U) < 0x82) goto LAB_00113fab;
        pcVar13 = pcVar13 + 1;
      }
      iVar10 = iVar10 + cVar8;
      if ((iVar10 == 0) || ((int)uVar12 <= iVar10)) goto LAB_00113fab;
      uVar4 = local_818 + 1;
      if (local_810 < uVar4) {
        (*(code *)*local_828)(&local_828,uVar4);
        uVar4 = local_818 + 1;
        cVar3 = (this->sep_).thousands_sep;
        puVar11 = local_820;
      }
      puVar11[local_818] = iVar10;
      local_818 = uVar4;
      if (cVar3 == '\0') goto LAB_00113fab;
    } while( true );
  }
  iVar10 = 0;
LAB_00113fb6:
  if (0 < (int)uVar12) {
    uVar4 = (out.container)->size_;
    uVar14 = 0;
    do {
      uVar7 = (out.container)->capacity_;
      if ((int)uVar6 == local_820[iVar10]) {
        cVar2 = (this->sep_).thousands_sep;
        uVar1 = uVar4 + 1;
        uVar5 = uVar4;
        uVar4 = uVar1;
        if (uVar7 < uVar1) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar5 = (out.container)->size_;
          uVar7 = (out.container)->capacity_;
          uVar4 = uVar5 + 1;
        }
        (out.container)->size_ = uVar4;
        (out.container)->ptr_[uVar5] = cVar2;
        iVar10 = iVar10 + -1;
      }
      cVar2 = digits.data_[uVar14];
      uVar1 = uVar4 + 1;
      uVar5 = uVar4;
      uVar4 = uVar1;
      if (uVar7 < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container);
        uVar5 = (out.container)->size_;
        uVar4 = uVar5 + 1;
      }
      (out.container)->size_ = uVar4;
      (out.container)->ptr_[uVar5] = cVar2;
      uVar14 = uVar14 + 1;
      uVar6 = (ulong)((int)uVar6 - 1);
      puVar11 = local_820;
    } while ((uVar12 & 0x7fffffff) != uVar14);
  }
  if (puVar11 != local_808) {
    operator_delete(puVar11,local_810 << 2);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
LAB_00113fab:
  iVar10 = (int)local_818 + -1;
  goto LAB_00113fb6;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }